

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updateAPF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  int iVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar3;
  value_type_conflict1 *__x;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  int k;
  int columnOut;
  int i;
  int PFcountX0;
  value_type_conflict1 *in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  undefined4 local_58;
  undefined4 local_44;
  undefined4 local_30;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  for (local_30 = 0; local_30 < *(int *)(in_RSI + 0x84); local_30 = local_30 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x88),(long)local_30);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
               (value_type *)in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xa0),(long)local_30);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  iVar1 = *(int *)(*(long *)(in_RDI + 0x40) + (long)in_ECX * 4);
  if (iVar1 < *(int *)(in_RDI + 0x24)) {
    for (local_44 = *(int *)(*(long *)(in_RDI + 0x28) + (long)iVar1 * 4);
        local_44 < *(int *)(*(long *)(in_RDI + 0x28) + (long)(iVar1 + 1) * 4);
        local_44 = local_44 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                 (value_type *)in_stack_ffffffffffffff68);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
               (value_type *)in_stack_ffffffffffffff58);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
             (value_type *)in_stack_ffffffffffffff58);
  for (local_58 = 0; local_58 < *(int *)(in_RDX + 0x84); local_58 = local_58 + 1) {
    in_stack_ffffffffffffff70 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x508);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x88),(long)local_58);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
               (value_type *)in_stack_ffffffffffffff68);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDX + 0xa0),(long)local_58);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x4f0);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type *)in_stack_ffffffffffffff58)
  ;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x508));
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + ((int)sVar3 - (int)sVar2);
  __x = (value_type_conflict1 *)(in_RDI + 0x4c0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_ECX);
  std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffff70,__x);
  return;
}

Assistant:

void HFactor::updateAPF(HVector *aq, HVector *ep, int iRow, int *hint) {
    int PFcountX0 = PFindex.size();

    // Store elements
    for (int i = 0; i < aq->packCount; i++) {
        PFindex.push_back(aq->packIndex[i]);
        PFvalue.push_back(aq->packValue[i]);
    }

    int columnOut = baseIndex[iRow];
    if (columnOut >= numCol) {
        PFindex.push_back(columnOut - numCol);
        PFvalue.push_back(-1);
    } else {
        for (int k = Astart[columnOut]; k < Astart[columnOut + 1]; k++) {
            PFindex.push_back(Aindex[k]);
            PFvalue.push_back(-Avalue[k]);
        }
    }
    PFstart.push_back(PFindex.size());

    for (int i = 0; i < ep->packCount; i++) {
        PFindex.push_back(ep->packIndex[i]);
        PFvalue.push_back(ep->packValue[i]);
    }
    PFstart.push_back(PFindex.size());
    FtotalX += PFindex.size() - PFcountX0;

    // Store pivot
    PFpivotValue.push_back(aq->array[iRow]);

}